

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(OPAtomIndexFooter *this,IndexEntry *Entry)

{
  ui64_t uVar1;
  ui64_t uVar2;
  ILogSink *this_00;
  IndexTableSegment *pIVar3;
  size_type sVar4;
  ui64_t StartPosition;
  IndexEntry *Entry_local;
  OPAtomIndexFooter *this_local;
  
  if (this->m_BytesPerEditUnit == 0) {
    if (this->m_CurrentSegment == (IndexTableSegment *)0x0) {
      pIVar3 = (IndexTableSegment *)operator_new(0x120);
      IndexTableSegment::IndexTableSegment(pIVar3,(this->super_Partition).m_Dict);
      this->m_CurrentSegment = pIVar3;
      if (this->m_CurrentSegment == (IndexTableSegment *)0x0) {
        __assert_fail("m_CurrentSegment",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                      ,0x575,
                      "virtual void ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(const IndexTableSegment::IndexEntry &)"
                     );
      }
      (*(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])
                (this,this->m_CurrentSegment);
      std::
      vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
      ::push_back(&(this->m_CurrentSegment->DeltaEntryArray).
                   super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
                   .
                   super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                  ,&this->m_DefaultDeltaEntry);
      Rational::operator=(&this->m_CurrentSegment->IndexEditRate,&this->m_EditRate);
      this->m_CurrentSegment->IndexStartPosition = 0;
    }
    else {
      sVar4 = std::
              vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
              ::size(&(this->m_CurrentSegment->IndexEntryArray).
                      super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                      .
                      super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                    );
      if (4999 < sVar4) {
        sVar4 = std::
                vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                ::size(&(this->m_CurrentSegment->IndexEntryArray).
                        super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                        .
                        super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                      );
        this->m_CurrentSegment->IndexDuration = sVar4;
        uVar1 = this->m_CurrentSegment->IndexStartPosition;
        uVar2 = this->m_CurrentSegment->IndexDuration;
        pIVar3 = (IndexTableSegment *)operator_new(0x120);
        IndexTableSegment::IndexTableSegment(pIVar3,(this->super_Partition).m_Dict);
        this->m_CurrentSegment = pIVar3;
        if (this->m_CurrentSegment == (IndexTableSegment *)0x0) {
          __assert_fail("m_CurrentSegment",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                        ,0x581,
                        "virtual void ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(const IndexTableSegment::IndexEntry &)"
                       );
        }
        (*(this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0xd])
                  (this,this->m_CurrentSegment);
        std::
        vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
        ::push_back(&(this->m_CurrentSegment->DeltaEntryArray).
                     super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
                     .
                     super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                    ,&this->m_DefaultDeltaEntry);
        Rational::operator=(&this->m_CurrentSegment->IndexEditRate,&this->m_EditRate);
        this->m_CurrentSegment->IndexStartPosition = uVar1 + uVar2;
      }
    }
    std::
    vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
    ::push_back(&(this->m_CurrentSegment->IndexEntryArray).
                 super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                 .
                 super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                ,Entry);
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"Call to PushIndexEntry() failed: index is CBR\n");
  }
  return;
}

Assistant:

void
ASDCP::MXF::OPAtomIndexFooter::PushIndexEntry(const IndexTableSegment::IndexEntry& Entry)
{
  if ( m_BytesPerEditUnit != 0 )  // are we CBR? that's bad 
    {
      DefaultLogSink().Error("Call to PushIndexEntry() failed: index is CBR\n");
      return;
    }

  // do we have an available segment?
  if ( m_CurrentSegment == 0 )
    { // no, set up a new segment
      m_CurrentSegment = new IndexTableSegment(m_Dict);
      assert(m_CurrentSegment);
      AddChildObject(m_CurrentSegment);
      m_CurrentSegment->DeltaEntryArray.push_back(m_DefaultDeltaEntry);
      m_CurrentSegment->IndexEditRate = m_EditRate;
      m_CurrentSegment->IndexStartPosition = 0;
    }
  else if ( m_CurrentSegment->IndexEntryArray.size() >= CBRIndexEntriesPerSegment )
    { // no, this one is full, start another
      m_CurrentSegment->IndexDuration = m_CurrentSegment->IndexEntryArray.size();
      ui64_t StartPosition = m_CurrentSegment->IndexStartPosition + m_CurrentSegment->IndexDuration;

      m_CurrentSegment = new IndexTableSegment(m_Dict);
      assert(m_CurrentSegment);
      AddChildObject(m_CurrentSegment);
      m_CurrentSegment->DeltaEntryArray.push_back(m_DefaultDeltaEntry);
      m_CurrentSegment->IndexEditRate = m_EditRate;
      m_CurrentSegment->IndexStartPosition = StartPosition;
    }

  m_CurrentSegment->IndexEntryArray.push_back(Entry);
}